

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitles.cpp
# Opt level: O2

long __thiscall
text_subtitles::TextToPGSConverter::composeWindow
          (TextToPGSConverter *this,uint8_t *buff,uint16_t top,uint16_t height)

{
  *buff = '\0';
  AV_WB16(buff + 1,0);
  AV_WB16(buff + 3,top);
  AV_WB16(buff + 5,this->m_videoWidth);
  AV_WB16(buff + 7,height);
  return 9;
}

Assistant:

long TextToPGSConverter::composeWindow(uint8_t* buff, const uint16_t top, const uint16_t height) const
{
    uint8_t* curPos = buff;
    *curPos++ = 0;  // window ID
    AV_WB16(curPos, 0);
    curPos += 2;
    AV_WB16(curPos, top);
    curPos += 2;
    AV_WB16(curPos, m_videoWidth);
    curPos += 2;
    AV_WB16(curPos, height);
    curPos += 2;
    return static_cast<long>(curPos - buff);
}